

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O3

void cmsysProcess_Execute(cmsysProcess *cp)

{
  int *p_00;
  cmsysProcess **__src;
  int iVar1;
  int iVar2;
  pid_t *ppVar3;
  int *piVar4;
  char *pcVar5;
  cmsysProcess **__dest;
  int iVar6;
  size_t __size;
  long lVar7;
  int nextStdIn;
  int p_3 [2];
  int p [2];
  int local_dc;
  kwsysProcessInstances local_d8;
  _union_1457 local_c8;
  int iStack_c0;
  int aiStack_bc [31];
  undefined4 local_40;
  
  if (cp == (cmsysProcess *)0x0) {
    return;
  }
  if (cp->State == 3) {
    return;
  }
  iVar2 = cp->NumberOfCommands;
  if (iVar2 < 1) {
    builtin_strncpy(cp->ErrorMessage,"No command",0xb);
    goto LAB_00133c70;
  }
  cp->PipeChildStd[0] = -1;
  cp->PipeChildStd[1] = -1;
  cp->PipeChildStd[2] = -1;
  cp->SignalPipe = -1;
  cp->PipeReadEnds[0] = -1;
  cp->PipeReadEnds[1] = -1;
  cp->PipeReadEnds[2] = -1;
  cp->PipeChildStd[0] = -1;
  cp->SelectError = 0;
  *(undefined4 *)&(cp->StartTime).tv_sec = 0xffffffff;
  *(undefined4 *)((long)&(cp->StartTime).tv_sec + 4) = 0xffffffff;
  *(undefined4 *)&(cp->StartTime).tv_usec = 0xffffffff;
  *(undefined4 *)((long)&(cp->StartTime).tv_usec + 4) = 0xffffffff;
  *(undefined4 *)&(cp->TimeoutTime).tv_sec = 0xffffffff;
  *(undefined4 *)((long)&(cp->TimeoutTime).tv_sec + 4) = 0xffffffff;
  *(undefined4 *)&(cp->TimeoutTime).tv_usec = 0xffffffff;
  *(undefined4 *)((long)&(cp->TimeoutTime).tv_usec + 4) = 0xffffffff;
  cp->Killed = 0;
  memset(&cp->TimeoutExpired,0,0x94);
  cp->ExitCode = 1;
  cp->ExitValue = 1;
  cp->ErrorMessage[0] = '\0';
  builtin_strncpy(cp->ExitExceptionString,"No exception",0xd);
  if (cp->ForkPIDs != (pid_t *)0x0) {
    free(cp->ForkPIDs);
    iVar2 = cp->NumberOfCommands;
  }
  __size = (long)iVar2 << 2;
  ppVar3 = (pid_t *)calloc(1,__size);
  cp->ForkPIDs = ppVar3;
  if (ppVar3 != (pid_t *)0x0) {
    if (cp->CommandExitCodes != (int *)0x0) {
      free(cp->CommandExitCodes);
      __size = (long)cp->NumberOfCommands << 2;
    }
    piVar4 = (int *)calloc(1,__size);
    cp->CommandExitCodes = piVar4;
    if (piVar4 != (int *)0x0) {
      if (cp->WorkingDirectory == (char *)0x0) {
LAB_00133c8c:
        if (cp->OptionDetach == 0) {
          iVar2 = pipe((int *)&local_c8);
          if (iVar2 < 0) goto LAB_0013421e;
          cp->PipeReadEnds[2] = local_c8._0_4_;
          cp->SignalPipe = local_c8._4_4_;
          iVar2 = kwsysProcessSetNonBlocking(local_c8._0_4_);
          if (iVar2 == 0) goto LAB_0013421e;
          iVar2 = kwsysProcessSetNonBlocking(local_c8._4_4_);
          if ((iVar2 == 0) ||
             (iVar2 = fcntl64((ulong)local_c8.sa_handler & 0xffffffff,2,1), iVar2 < 0))
          goto LAB_0013421e;
          iVar6 = fcntl64(local_c8._4_4_,2,1);
          __src = kwsysProcesses.Processes;
          iVar2 = kwsysProcesses.Count;
          if (iVar6 < 0) goto LAB_0013421e;
          lVar7 = (long)kwsysProcesses.Count;
          local_d8.Size = kwsysProcesses.Size;
          local_d8.Processes = kwsysProcesses.Processes;
          __dest = kwsysProcesses.Processes;
          if (kwsysProcesses.Count == kwsysProcesses.Size) {
            local_d8.Size = 4;
            if (kwsysProcesses.Count != 0) {
              local_d8.Size = kwsysProcesses.Count * 2;
            }
            __dest = (cmsysProcess **)malloc((long)local_d8.Size << 3);
            local_d8.Processes = __dest;
            if (__dest == (cmsysProcess **)0x0) goto LAB_0013421e;
            if (0 < iVar2) {
              memcpy(__dest,__src,lVar7 * 8);
            }
          }
          local_d8.Count = iVar2 + 1;
          __dest[lVar7] = cp;
          kwsysProcessesUpdate(&local_d8);
          if (__dest != __src) {
            free(__src);
          }
          if (iVar2 == 0) {
            memset(&iStack_c0,0,0x90);
            local_c8.sa_handler = kwsysProcessesSignalHandler;
            local_40 = 0x10000005;
            do {
              iVar2 = sigaction(0x11,(sigaction *)&local_c8,
                                (sigaction *)&kwsysProcessesOldSigChldAction);
              if (-1 < iVar2) break;
              piVar4 = __errno_location();
            } while (*piVar4 == 4);
          }
        }
        if (cp->PipeFileSTDIN == (char *)0x0) {
          if (cp->PipeSharedSTDIN == 0) {
            iVar2 = cp->PipeNativeSTDIN[0];
            if (-1 < iVar2) {
              cp->PipeChildStd[0] = iVar2;
              iVar2 = fcntl64(iVar2,2,1);
              if (iVar2 < 0) goto LAB_0013421e;
              iVar2 = cp->PipeNativeSTDIN[1];
              goto LAB_00133cbb;
            }
            cp->PipeChildStd[0] = -1;
          }
          else {
            cp->PipeChildStd[0] = 0;
          }
        }
        else {
          iVar2 = open64(cp->PipeFileSTDIN,0);
          cp->PipeChildStd[0] = iVar2;
          if (iVar2 < 0) goto LAB_0013421e;
LAB_00133cbb:
          iVar2 = fcntl64(iVar2,2,1);
          if (iVar2 < 0) goto LAB_0013421e;
        }
        iVar2 = pipe((int *)&local_c8);
        if (iVar2 < 0) goto LAB_0013421e;
        cp->PipeReadEnds[0] = local_c8._0_4_;
        cp->PipeChildStd[1] = local_c8._4_4_;
        iVar2 = fcntl64((ulong)local_c8.sa_handler & 0xffffffff,2,1);
        if (iVar2 < 0) goto LAB_0013421e;
        iVar2 = fcntl64(local_c8._4_4_,2,1);
        if (iVar2 < 0) goto LAB_0013421e;
        iVar2 = kwsysProcessSetNonBlocking(local_c8._0_4_);
        if (iVar2 == 0) goto LAB_0013421e;
        piVar4 = cp->PipeChildStd + 1;
        if (cp->PipeFileSTDOUT == (char *)0x0) {
          if (cp->PipeSharedSTDOUT == 0) {
            if (-1 < cp->PipeNativeSTDOUT[1]) {
              iVar2 = kwsysProcessSetupOutputPipeNative(piVar4,cp->PipeNativeSTDOUT);
              goto LAB_00133ed9;
            }
          }
          else {
            kwsysProcessCleanupDescriptor(piVar4);
            *piVar4 = 1;
          }
        }
        else {
          iVar2 = kwsysProcessSetupOutputPipeFile(piVar4,cp->PipeFileSTDOUT);
LAB_00133ed9:
          if (iVar2 == 0) goto LAB_0013421e;
        }
        iVar2 = pipe((int *)&local_c8);
        if (-1 < iVar2) {
          cp->PipeReadEnds[1] = local_c8._0_4_;
          cp->PipeChildStd[2] = local_c8._4_4_;
          iVar2 = fcntl64((ulong)local_c8.sa_handler & 0xffffffff,2,1);
          if (iVar2 < 0) goto LAB_0013421e;
          iVar2 = fcntl64(local_c8._4_4_,2,1);
          if (iVar2 < 0) goto LAB_0013421e;
          iVar2 = kwsysProcessSetNonBlocking(local_c8._0_4_);
          if (iVar2 == 0) goto LAB_0013421e;
          p_00 = cp->PipeChildStd + 2;
          if (cp->PipeFileSTDERR == (char *)0x0) {
            if (cp->PipeSharedSTDERR != 0) {
              kwsysProcessCleanupDescriptor(p_00);
              *p_00 = 2;
              goto LAB_00134000;
            }
            if (cp->PipeNativeSTDERR[1] < 0) goto LAB_00134000;
            iVar2 = kwsysProcessSetupOutputPipeNative(p_00,cp->PipeNativeSTDERR);
          }
          else {
            iVar2 = kwsysProcessSetupOutputPipeFile(p_00,cp->PipeFileSTDERR);
          }
          if (iVar2 != 0) {
LAB_00134000:
            gettimeofday((timeval *)&local_c8,(__timezone_ptr_t)0x0);
            (cp->StartTime).tv_sec = (long)local_c8;
            (cp->StartTime).tv_usec = CONCAT44(aiStack_bc[0],iStack_c0);
            *(undefined4 *)&(cp->TimeoutTime).tv_sec = 0xffffffff;
            *(undefined4 *)((long)&(cp->TimeoutTime).tv_sec + 4) = 0xffffffff;
            *(undefined4 *)&(cp->TimeoutTime).tv_usec = 0xffffffff;
            *(undefined4 *)((long)&(cp->TimeoutTime).tv_usec + 4) = 0xffffffff;
            local_c8._4_4_ = 0xffffffff;
            iStack_c0 = -1;
            aiStack_bc[0] = -1;
            aiStack_bc[1] = 0xffffffff;
            local_dc = cp->PipeChildStd[0];
            iVar2 = cp->NumberOfCommands;
            if (0 < iVar2) {
              iVar6 = 0;
              do {
                iVar1 = local_dc;
                local_c8._0_4_ = local_dc;
                if (iVar6 != iVar2 + -1) {
                  local_d8.Count = -1;
                  local_d8.Size = -1;
                  iVar2 = pipe(&local_d8.Count);
                  if (-1 < iVar2) {
                    iVar2 = fcntl64(local_d8._0_8_ & 0xffffffff,2,1);
                    if (-1 < iVar2) {
                      iVar2 = fcntl64(local_d8.Size,2,1);
                      if (-1 < iVar2) {
                        local_dc = local_d8.Count;
                        local_c8._4_4_ = local_d8.Size;
                        goto LAB_001340ce;
                      }
                    }
                    close(local_d8.Count);
                    close(local_d8.Size);
                  }
LAB_0013420b:
                  if (local_dc != cp->PipeChildStd[0]) {
                    kwsysProcessCleanupDescriptor(&local_dc);
                  }
                  goto LAB_0013421e;
                }
                local_dc = -1;
                local_c8._4_4_ = *piVar4;
                local_c8._0_4_ = iVar1;
LAB_001340ce:
                iStack_c0 = cp->PipeChildStd[(ulong)(cp->MergeOutput == 0) + 1];
                iVar2 = kwsysProcessCreate(cp,iVar6,(kwsysProcessCreateInformation *)&local_c8);
                if (local_c8._0_4_ != cp->PipeChildStd[0]) {
                  kwsysProcessCleanupDescriptor((int *)&local_c8);
                }
                if (local_c8._4_4_ != *piVar4) {
                  kwsysProcessCleanupDescriptor((int *)((long)&local_c8 + 4));
                }
                if ((iStack_c0 != *p_00) && (cp->MergeOutput == 0)) {
                  kwsysProcessCleanupDescriptor(&iStack_c0);
                }
                if (iVar2 == 0) {
                  kwsysProcessCleanupDescriptor(aiStack_bc);
                  kwsysProcessCleanupDescriptor(aiStack_bc + 1);
                  goto LAB_0013420b;
                }
                iVar6 = iVar6 + 1;
                iVar2 = cp->NumberOfCommands;
              } while (iVar6 < iVar2);
            }
            lVar7 = 0;
            do {
              kwsysProcessCleanupDescriptor((int *)(lVar7 + (long)cp->PipeChildStd));
              lVar7 = lVar7 + 4;
            } while (lVar7 != 0xc);
            if (cp->RealWorkingDirectory != (char *)0x0) {
              do {
                iVar2 = chdir(cp->RealWorkingDirectory);
                if (-1 < iVar2) break;
                piVar4 = __errno_location();
              } while (*piVar4 == 4);
              free(cp->RealWorkingDirectory);
              cp->RealWorkingDirectory = (char *)0x0;
            }
            cp->PipesLeft = 3;
            cp->State = 3;
            cp->Detached = cp->OptionDetach;
            return;
          }
        }
LAB_0013421e:
        kwsysProcessCleanup(cp,1);
        return;
      }
      cp->RealWorkingDirectoryLength = 0x1000;
      pcVar5 = (char *)malloc(0x1000);
      cp->RealWorkingDirectory = pcVar5;
      if (pcVar5 != (char *)0x0) {
        pcVar5 = getcwd(cp->RealWorkingDirectory,(long)cp->RealWorkingDirectoryLength);
        if (pcVar5 != (char *)0x0) {
          do {
            iVar2 = chdir(cp->WorkingDirectory);
            if (-1 < iVar2) goto LAB_00133c8c;
            piVar4 = __errno_location();
          } while (*piVar4 == 4);
        }
        kwsysProcessCleanup(cp,1);
        return;
      }
    }
  }
  builtin_strncpy(cp->ErrorMessage,"Out of memory",0xe);
LAB_00133c70:
  cp->State = 1;
  return;
}

Assistant:

void kwsysProcess_Execute(kwsysProcess* cp)
{
  int i;

  /* Do not execute a second copy simultaneously.  */
  if(!cp || cp->State == kwsysProcess_State_Executing)
    {
    return;
    }

  /* Make sure we have something to run.  */
  if(cp->NumberOfCommands < 1)
    {
    strcpy(cp->ErrorMessage, "No command");
    cp->State = kwsysProcess_State_Error;
    return;
    }

  /* Initialize the control structure for a new process.  */
  if(!kwsysProcessInitialize(cp))
    {
    strcpy(cp->ErrorMessage, "Out of memory");
    cp->State = kwsysProcess_State_Error;
    return;
    }

#if defined(__VMS)
  /* Make sure pipes behave like streams on VMS.  */
  if(!kwsysProcessSetVMSFeature("DECC$STREAM_PIPE", 1))
    {
    kwsysProcessCleanup(cp, 1);
    return;
    }
#endif

  /* Save the real working directory of this process and change to
     the working directory for the child processes.  This is needed
     to make pipe file paths evaluate correctly.  */
  if(cp->WorkingDirectory)
    {
    int r;
    if(!getcwd(cp->RealWorkingDirectory,
               (size_t)(cp->RealWorkingDirectoryLength)))
      {
      kwsysProcessCleanup(cp, 1);
      return;
      }

    /* Some platforms specify that the chdir call may be
       interrupted.  Repeat the call until it finishes.  */
    while(((r = chdir(cp->WorkingDirectory)) < 0) && (errno == EINTR));
    if(r < 0)
      {
      kwsysProcessCleanup(cp, 1);
      return;
      }
    }

  /* If not running a detached child, add this object to the global
     set of process objects that wish to be notified when a child
     exits.  */
  if(!cp->OptionDetach)
    {
    if(!kwsysProcessesAdd(cp))
      {
      kwsysProcessCleanup(cp, 1);
      return;
      }
    }

  /* Setup the stdin pipe for the first process.  */
  if(cp->PipeFileSTDIN)
    {
    /* Open a file for the child's stdin to read.  */
    cp->PipeChildStd[0] = open(cp->PipeFileSTDIN, O_RDONLY);
    if(cp->PipeChildStd[0] < 0)
      {
      kwsysProcessCleanup(cp, 1);
      return;
      }

    /* Set close-on-exec flag on the pipe's end.  */
    if(fcntl(cp->PipeChildStd[0], F_SETFD, FD_CLOEXEC) < 0)
      {
      kwsysProcessCleanup(cp, 1);
      return;
      }
    }
  else if(cp->PipeSharedSTDIN)
    {
    cp->PipeChildStd[0] = 0;
    }
  else if(cp->PipeNativeSTDIN[0] >= 0)
    {
    cp->PipeChildStd[0] = cp->PipeNativeSTDIN[0];

    /* Set close-on-exec flag on the pipe's ends.  The read end will
       be dup2-ed into the stdin descriptor after the fork but before
       the exec.  */
    if((fcntl(cp->PipeNativeSTDIN[0], F_SETFD, FD_CLOEXEC) < 0) ||
       (fcntl(cp->PipeNativeSTDIN[1], F_SETFD, FD_CLOEXEC) < 0))
      {
      kwsysProcessCleanup(cp, 1);
      return;
      }
    }
  else
    {
    cp->PipeChildStd[0] = -1;
    }

  /* Create the output pipe for the last process.
     We always create this so the pipe can be passed to select even if
     it will report closed immediately.  */
  {
  /* Create the pipe.  */
  int p[2];
  if(pipe(p KWSYSPE_VMS_NONBLOCK) < 0)
    {
    kwsysProcessCleanup(cp, 1);
    return;
    }

  /* Store the pipe.  */
  cp->PipeReadEnds[KWSYSPE_PIPE_STDOUT] = p[0];
  cp->PipeChildStd[1] = p[1];

  /* Set close-on-exec flag on the pipe's ends.  */
  if((fcntl(p[0], F_SETFD, FD_CLOEXEC) < 0) ||
     (fcntl(p[1], F_SETFD, FD_CLOEXEC) < 0))
    {
    kwsysProcessCleanup(cp, 1);
    return;
    }

  /* Set to non-blocking in case select lies, or for the polling
     implementation.  */
  if(!kwsysProcessSetNonBlocking(p[0]))
    {
    kwsysProcessCleanup(cp, 1);
    return;
    }
  }

  if (cp->PipeFileSTDOUT)
    {
    /* Use a file for stdout.  */
    if(!kwsysProcessSetupOutputPipeFile(&cp->PipeChildStd[1],
                                        cp->PipeFileSTDOUT))
      {
      kwsysProcessCleanup(cp, 1);
      return;
      }
    }
  else if (cp->PipeSharedSTDOUT)
    {
    /* Use the parent stdout.  */
    kwsysProcessCleanupDescriptor(&cp->PipeChildStd[1]);
    cp->PipeChildStd[1] = 1;
    }
  else if (cp->PipeNativeSTDOUT[1] >= 0)
    {
    /* Use the given descriptor for stdout.  */
    if(!kwsysProcessSetupOutputPipeNative(&cp->PipeChildStd[1],
                                          cp->PipeNativeSTDOUT))
      {
      kwsysProcessCleanup(cp, 1);
      return;
      }
    }

  /* Create stderr pipe to be shared by all processes in the pipeline.
     We always create this so the pipe can be passed to select even if
     it will report closed immediately.  */
  {
  /* Create the pipe.  */
  int p[2];
  if(pipe(p KWSYSPE_VMS_NONBLOCK) < 0)
    {
    kwsysProcessCleanup(cp, 1);
    return;
    }

  /* Store the pipe.  */
  cp->PipeReadEnds[KWSYSPE_PIPE_STDERR] = p[0];
  cp->PipeChildStd[2] = p[1];

  /* Set close-on-exec flag on the pipe's ends.  */
  if((fcntl(p[0], F_SETFD, FD_CLOEXEC) < 0) ||
     (fcntl(p[1], F_SETFD, FD_CLOEXEC) < 0))
    {
    kwsysProcessCleanup(cp, 1);
    return;
    }

  /* Set to non-blocking in case select lies, or for the polling
     implementation.  */
  if(!kwsysProcessSetNonBlocking(p[0]))
    {
    kwsysProcessCleanup(cp, 1);
    return;
    }
  }

  if (cp->PipeFileSTDERR)
    {
    /* Use a file for stderr.  */
    if(!kwsysProcessSetupOutputPipeFile(&cp->PipeChildStd[2],
                                        cp->PipeFileSTDERR))
      {
      kwsysProcessCleanup(cp, 1);
      return;
      }
    }
  else if (cp->PipeSharedSTDERR)
    {
    /* Use the parent stderr.  */
    kwsysProcessCleanupDescriptor(&cp->PipeChildStd[2]);
    cp->PipeChildStd[2] = 2;
    }
  else if (cp->PipeNativeSTDERR[1] >= 0)
    {
    /* Use the given handle for stderr.  */
    if(!kwsysProcessSetupOutputPipeNative(&cp->PipeChildStd[2],
                                          cp->PipeNativeSTDERR))
      {
      kwsysProcessCleanup(cp, 1);
      return;
      }
    }

  /* The timeout period starts now.  */
  cp->StartTime = kwsysProcessTimeGetCurrent();
  cp->TimeoutTime.tv_sec = -1;
  cp->TimeoutTime.tv_usec = -1;

  /* Create the pipeline of processes.  */
  {
  kwsysProcessCreateInformation si = {-1, -1, -1, {-1, -1}};
  int nextStdIn = cp->PipeChildStd[0];
  for(i=0; i < cp->NumberOfCommands; ++i)
    {
    /* Setup the process's pipes.  */
    si.StdIn = nextStdIn;
    if (i == cp->NumberOfCommands-1)
      {
      nextStdIn = -1;
      si.StdOut = cp->PipeChildStd[1];
      }
    else
      {
      /* Create a pipe to sit between the children.  */
      int p[2] = {-1,-1};
      if(pipe(p KWSYSPE_VMS_NONBLOCK) < 0)
        {
        if (nextStdIn != cp->PipeChildStd[0])
          {
          kwsysProcessCleanupDescriptor(&nextStdIn);
          }
        kwsysProcessCleanup(cp, 1);
        return;
        }

      /* Set close-on-exec flag on the pipe's ends.  */
      if((fcntl(p[0], F_SETFD, FD_CLOEXEC) < 0) ||
         (fcntl(p[1], F_SETFD, FD_CLOEXEC) < 0))
        {
        close(p[0]);
        close(p[1]);
        if (nextStdIn != cp->PipeChildStd[0])
          {
          kwsysProcessCleanupDescriptor(&nextStdIn);
          }
        kwsysProcessCleanup(cp, 1);
        return;
        }
      nextStdIn = p[0];
      si.StdOut = p[1];
      }
    si.StdErr = cp->MergeOutput? cp->PipeChildStd[1] : cp->PipeChildStd[2];

    {
    int res = kwsysProcessCreate(cp, i, &si);

    /* Close our copies of pipes used between children.  */
    if (si.StdIn != cp->PipeChildStd[0])
      {
      kwsysProcessCleanupDescriptor(&si.StdIn);
      }
    if (si.StdOut != cp->PipeChildStd[1])
      {
      kwsysProcessCleanupDescriptor(&si.StdOut);
      }
    if (si.StdErr != cp->PipeChildStd[2] && !cp->MergeOutput)
      {
      kwsysProcessCleanupDescriptor(&si.StdErr);
      }

    if(!res)
      {
      kwsysProcessCleanupDescriptor(&si.ErrorPipe[0]);
      kwsysProcessCleanupDescriptor(&si.ErrorPipe[1]);
      if (nextStdIn != cp->PipeChildStd[0])
        {
        kwsysProcessCleanupDescriptor(&nextStdIn);
        }
      kwsysProcessCleanup(cp, 1);
      return;
      }
    }
    }
  }

  /* The parent process does not need the child's pipe ends.  */
  for (i=0; i < 3; ++i)
    {
    kwsysProcessCleanupDescriptor(&cp->PipeChildStd[i]);
    }

  /* Restore the working directory. */
  if(cp->RealWorkingDirectory)
    {
    /* Some platforms specify that the chdir call may be
       interrupted.  Repeat the call until it finishes.  */
    while((chdir(cp->RealWorkingDirectory) < 0) && (errno == EINTR));
    free(cp->RealWorkingDirectory);
    cp->RealWorkingDirectory = 0;
    }

  /* All the pipes are now open.  */
  cp->PipesLeft = KWSYSPE_PIPE_COUNT;

  /* The process has now started.  */
  cp->State = kwsysProcess_State_Executing;
  cp->Detached = cp->OptionDetach;
}